

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputCheck.h
# Opt level: O0

int InputCheck(string *getLevelNumber)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int Number;
  string *getLevelNumber_local;
  
  bVar1 = std::operator==(getLevelNumber,"exit");
  if (!bVar1) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar2 = atoi(pcVar3);
    if (iVar2 == 0) {
      getLevelNumber_local._4_4_ = 0;
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      getLevelNumber_local._4_4_ = atoi(pcVar3);
    }
    return getLevelNumber_local._4_4_;
  }
  exit(1);
}

Assistant:

int InputCheck(std::string getLevelNumber)
{
    int Number = 0;
    if (getLevelNumber == "exit") {
        exit(1);
    }
    if (atoi(getLevelNumber.c_str()) == 0) {

        return 0;
    }
    Number = atoi(getLevelNumber.c_str()); //

    return Number;
}